

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::PushDebuggerScope(ByteCodeWriter *this,DebuggerScope *debuggerScope)

{
  DebuggerScope *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xbef,"(debuggerScope)","debuggerScope");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar1 = this->m_currentDebuggerScope;
  Memory::Recycler::WBSetBit((char *)&debuggerScope->parentScope);
  (debuggerScope->parentScope).ptr = pDVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&debuggerScope->parentScope);
  this->m_currentDebuggerScope = debuggerScope;
  if (DAT_015d346a == '\x01') {
    Output::Trace(DebuggerPhase,L"PushDebuggerScope() - Pushed scope 0x%p of type %d.\n",
                  debuggerScope,(ulong)debuggerScope->scopeType);
    return;
  }
  return;
}

Assistant:

void ByteCodeWriter::PushDebuggerScope(Js::DebuggerScope* debuggerScope)
    {
        Assert(debuggerScope);

        debuggerScope->SetParentScope(m_currentDebuggerScope);
        m_currentDebuggerScope = debuggerScope;
        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("PushDebuggerScope() - Pushed scope 0x%p of type %d.\n"), m_currentDebuggerScope, m_currentDebuggerScope->scopeType);
    }